

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fzn-chuffed.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  uint ii;
  ulong uVar2;
  int i;
  long lVar3;
  int argc_local;
  char **argv_local;
  vec<BoolView> ng;
  string local_90;
  string filename;
  string commandLine;
  
  commandLine._M_dataplus._M_p = (pointer)&commandLine.field_2;
  commandLine._M_string_length = 0;
  commandLine.field_2._M_local_buf[0] = '\0';
  argc_local = argc;
  argv_local = argv;
  for (lVar3 = 0; lVar3 < argc_local; lVar3 = lVar3 + 1) {
    if (lVar3 != 0) {
      std::__cxx11::string::append((char *)&commandLine);
    }
    std::__cxx11::string::append((char *)&commandLine);
  }
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_90,"fzn",(allocator *)&ng);
  parseOptions(&argc_local,&argv_local,&filename,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (argc_local == 1) {
    if (filename._M_string_length == 0) {
      FlatZinc::solve((istream *)&std::cin,(ostream *)&std::cerr);
    }
    else {
      FlatZinc::solve(&filename,(ostream *)&std::cerr);
    }
    signal(2,SIGINT_handler);
    Engine::set_assumptions(&engine,(vec<BoolView> *)(FlatZinc::s + 0x10));
    if ((engine.opt_var == (IntVar *)0x0) || (so.nof_solutions == 0)) {
      Engine::solve(&engine,FlatZinc::s,&commandLine);
    }
    else {
      engine.output_stream = (ostream *)(output_buffer_abi_cxx11_ + 0x10);
      Engine::solve(&engine,FlatZinc::s,&commandLine);
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)&std::cout,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    if (engine.status == RES_LUN) {
      ng.sz = 0;
      ng.cap = 0;
      ng.data = (BoolView *)0x0;
      Engine::retrieve_assumption_nogood(&ng);
      std::operator<<((ostream *)&std::cout,"% [");
      if (ng.sz != 0) {
        get_bv_string_abi_cxx11_(&local_90,ng.data,so.assump_int);
        std::operator<<((ostream *)&std::cout,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        lVar3 = 0x10;
        for (uVar2 = 1; uVar2 < (ng._0_8_ & 0xffffffff); uVar2 = uVar2 + 1) {
          poVar1 = std::operator<<((ostream *)&std::cout,", ");
          get_bv_string_abi_cxx11_
                    (&local_90,
                     (BoolView *)
                     ((long)&((ng.data)->super_Var).super_Branching._vptr_Branching + lVar3),
                     so.assump_int);
          std::operator<<(poVar1,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          lVar3 = lVar3 + 0x10;
        }
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"]");
      std::operator<<(poVar1,'\n');
      vec<BoolView>::~vec(&ng);
    }
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&commandLine);
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,*argv_local);
  poVar1 = std::operator<<(poVar1,": unrecognized option ");
  poVar1 = std::operator<<(poVar1,argv_local[1]);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,*argv_local);
  std::operator<<(poVar1,": use --help for more information.\n");
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
	try {
		// Make a copy of the arguments for posterity.
		std::string commandLine;
		for (int i = 0; i < argc; i++) {
			if (i > 0) {
				commandLine += " ";
			}
			commandLine += argv[i];
		}

		// if (argc == 2 && strcmp(argv[1], "--version") == 0) {
		//   std::cout << versionString << "\n";
		//   return 0;
		// }

		std::string filename;
		parseOptions(argc, argv, &filename, "fzn");

		if (argc != 1) {
			std::cerr << argv[0] << ": unrecognized option " << argv[1] << "\n";
			std::cerr << argv[0] << ": use --help for more information.\n";
			std::exit(EXIT_FAILURE);
		}

		if (filename.empty()) {
			FlatZinc::solve(std::cin, std::cerr);
		} else {
			FlatZinc::solve(filename);
		}

		// Install signal handler
#ifdef WIN32
		SetConsoleCtrlHandler((PHANDLER_ROUTINE)SIGINT_handler, true);
#else
		// TODO: Make signal handler use C linkage
		std::signal(SIGINT, SIGINT_handler);  // NOLINT(bugprone-signal-handler)
#endif

		engine.set_assumptions(FlatZinc::s->assumptions);
		if (engine.opt_var != nullptr && so.nof_solutions != 0) {
			engine.setOutputStream(output_buffer);
			engine.solve(FlatZinc::s, commandLine);
			std::cout << output_buffer.str();
		} else {
			engine.solve(FlatZinc::s, commandLine);
		}

		if (engine.status == RES_LUN) {
			vec<BoolView> ng;
			Engine::retrieve_assumption_nogood(ng);
			std::cout << "% [";
			if (ng.size() > 0) {
				std::cout << get_bv_string(ng[0], so.assump_int);
				for (unsigned int ii = 1; ii < ng.size(); ii++) {
					std::cout << ", " << get_bv_string(ng[ii], so.assump_int);
				}
			}
			std::cout << "]" << '\n';
		}
	} catch (const std::exception& e) {
		std::cerr << e.what() << '\n';
		std::exit(EXIT_FAILURE);
	} catch (const FlatZinc::Error& e) {
		std::cerr << e.toString() << '\n';
		std::exit(EXIT_FAILURE);
	} catch (...) {
		std::cerr << "  UNKNOWN EXCEPTION." << '\n';
		std::exit(EXIT_FAILURE);
	}
	return 0;
}